

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

_Bool art_node_iterator_lower_bound(art_node_t *node,art_iterator_t *iterator,art_key_chunk_t *key)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  size_t i;
  uint8_t *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  art_inner_node_t *node_00;
  art_val_t *paVar11;
  
  uVar7 = (ulong)node & 1;
  while (uVar7 == 0) {
    bVar1 = iterator->depth;
    bVar2 = ((art_inner_node_t *)node)->prefix_size;
    iVar4 = memcmp(((art_inner_node_t *)node)->prefix,key + bVar1,(ulong)bVar2);
    if (iVar4 < 0) goto LAB_0010dab2;
    node_00 = (art_inner_node_t *)node;
    if (iVar4 != 0) goto LAB_0010dad5;
    if (3 < ((art_inner_node_t *)node)->typecode) goto LAB_0010dab2;
    bVar1 = (key + bVar1)[bVar2];
    uVar7 = (ulong)bVar1;
    switch(((art_inner_node_t *)node)->typecode) {
    case '\0':
      if ((ulong)((art_inner_node_t *)((long)node + 7))->typecode != 0) {
        uVar10 = 0;
        while (bVar2 = ((art_inner_node_t *)((long)node + 7))->prefix[uVar10 - 1], bVar2 < bVar1) {
          uVar10 = uVar10 + 1;
          if (((art_inner_node_t *)((long)node + 7))->typecode == uVar10) goto LAB_0010dab2;
        }
        node_00 = *(art_inner_node_t **)((long)node + uVar10 * 8 + 0x10);
        goto LAB_0010d9f1;
      }
      goto LAB_0010dab2;
    case '\x01':
      if ((ulong)((art_inner_node_t *)((long)node + 7))->typecode == 0) goto LAB_0010dab2;
      uVar10 = 0;
      while (bVar2 = ((art_inner_node_t *)((long)node + 7))->prefix[uVar10 - 1], bVar2 < bVar1) {
        uVar10 = uVar10 + 1;
        if (((art_inner_node_t *)((long)node + 7))->typecode == uVar10) goto LAB_0010dab2;
      }
      node_00 = *(art_inner_node_t **)((long)node + uVar10 * 8 + 0x18);
LAB_0010d9f1:
      uVar10 = (ulong)bVar2 * 0x100 + uVar10;
      break;
    case '\x02':
      uVar10 = (ulong)CONCAT11(bVar1,bVar1);
      puVar6 = ((art_inner_node_t *)((long)node + 0xe))->prefix + uVar7;
      while ((ulong)*puVar6 == 0x30) {
        uVar10 = uVar10 + 0x101;
        puVar6 = puVar6 + 1;
        if (uVar10 == 0x10100) goto LAB_0010dab2;
      }
      node_00 = *(art_inner_node_t **)((long)node + (ulong)*puVar6 * 8 + 0x110);
      break;
    case '\x03':
      do {
        node_00 = *(art_inner_node_t **)((long)node + uVar7 * 8 + 0x10);
        if (node_00 != (art_inner_node_t *)0x0) goto LAB_0010d9a7;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x100);
      uVar7 = 0;
LAB_0010d9a7:
      uVar10 = uVar7 * 0x101;
    }
    if (node_00 == (art_inner_node_t *)0x0) goto LAB_0010dab2;
    art_iterator_down(iterator,(art_inner_node_t *)node,(uint8_t)uVar10);
    if ((uint)bVar1 < ((uint)(uVar10 >> 8) & 0xff)) {
LAB_0010dad5:
      art_node_init_iterator((art_node_t *)node_00,iterator,true);
      return true;
    }
    node = (art_node_t *)node_00;
    uVar7 = (ulong)node_00 & 1;
  }
  paVar11 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
  uVar5 = *(uint *)paVar11->key;
  uVar8 = *(uint *)key;
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  if (uVar5 == uVar8) {
    uVar5 = (uint)(ushort)(*(ushort *)(paVar11->key + 4) << 8 | *(ushort *)(paVar11->key + 4) >> 8);
    uVar8 = (uint)(ushort)(*(ushort *)(key + 4) << 8 | *(ushort *)(key + 4) >> 8);
    uVar9 = 0;
    if (uVar5 == uVar8) goto LAB_0010da7a;
  }
  uVar9 = -(uint)(uVar5 < uVar8) | 1;
LAB_0010da7a:
  if (-1 < (int)uVar9) {
    bVar1 = iterator->frame;
    iterator->frames[bVar1].node = node;
    iterator->frames[bVar1].index_in_node = '\0';
    *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(paVar11->key + 4);
    *(undefined4 *)iterator->key = *(undefined4 *)paVar11->key;
    iterator->value = paVar11;
    return true;
  }
LAB_0010dab2:
  _Var3 = art_iterator_up_and_move(iterator,true);
  return _Var3;
}

Assistant:

static bool art_node_iterator_lower_bound(const art_node_t *node,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(node)) {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return the
            // next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first leaf.
            return art_node_init_iterator(node, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child =
            art_node_lower_bound(node, key_chunk);
        if (indexed_child.child == NULL) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, inner_node, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, inner_node, indexed_child.index);
        node = indexed_child.child;
    }
    art_leaf_t *leaf = CAST_LEAF(node);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, leaf);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the next
    // leaf.
    return art_iterator_up_and_move(iterator, true);
}